

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_utils.c
# Opt level: O0

int qc_blockque_put(QcBlockQue *queue,void *ptr)

{
  int iVar1;
  int index;
  void *ptr_local;
  QcBlockQue *queue_local;
  
  qc_thread_condlock_lock(queue->cond_lock);
  iVar1 = qc_staticlist_get_head(&queue->lst_free);
  if (iVar1 == -99) {
    qc_thread_condlock_unlock(queue->cond_lock);
    queue_local._4_4_ = -100;
  }
  else if (iVar1 < 0) {
    _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_utils.c"
              ,0x1f9,"error happend when get from QcBlockQue->qc_staticlist_free.");
    qc_thread_condlock_unlock(queue->cond_lock);
    queue_local._4_4_ = -1;
  }
  else {
    queue->ptr_array[iVar1] = ptr;
    iVar1 = qc_staticlist_add_tail(&queue->lst_used,iVar1);
    if (iVar1 < 0) {
      _qc_error("/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_utils.c"
                ,0x203,"error happend when add tail to QcBlockQue->qc_staticlist_used.");
      qc_thread_condlock_unlock(queue->cond_lock);
      queue_local._4_4_ = -1;
    }
    else {
      qc_thread_condition_signal(queue->cond);
      qc_thread_condlock_unlock(queue->cond_lock);
      queue_local._4_4_ = 0;
    }
  }
  return queue_local._4_4_;
}

Assistant:

int qc_blockque_put(QcBlockQue *queue, void *ptr)
{
	int index;

	qc_thread_condlock_lock(queue->cond_lock);

	index = qc_staticlist_get_head(&queue->lst_free);
	if (QC_INVALID_INT == index)
	{
		qc_thread_condlock_unlock(queue->cond_lock);
		return QC_FULLED;
	}
	else if (index < 0)
	{
		qc_error("error happend when get from QcBlockQue->qc_staticlist_free.");
		qc_thread_condlock_unlock(queue->cond_lock);
		return -1;
	}

	queue->ptr_array[index] = ptr;

	index = qc_staticlist_add_tail(&queue->lst_used, index);
	if (index < 0)
	{
		qc_error("error happend when add tail to QcBlockQue->qc_staticlist_used.");
		qc_thread_condlock_unlock(queue->cond_lock);
		return -1;
	}

	qc_thread_condition_signal(queue->cond);
	qc_thread_condlock_unlock(queue->cond_lock);

	return 0;
}